

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Catridge.cpp
# Opt level: O0

void __thiscall Catridge::Catridge(Catridge *this,string *sFileName)

{
  byte bVar1;
  uchar *puVar2;
  shared_ptr<Mapper_000> local_250;
  undefined1 local_23d;
  uint8_t nFileType;
  char local_230 [8];
  ifstream ifs;
  undefined1 local_28 [4];
  uint8_t local_24;
  uint8_t local_23;
  byte local_22;
  byte local_21;
  sHeader header;
  string *sFileName_local;
  Catridge *this_local;
  
  this->mirror = HORIZONTAL;
  this->bImageValid = false;
  header._8_8_ = sFileName;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->vPRGMemory);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->vCHRMemory);
  std::shared_ptr<Mapper>::shared_ptr(&this->pMapper);
  this->nMapperID = '\0';
  this->nPRGBanks = '\0';
  this->nCHRBanks = '\0';
  std::ifstream::ifstream(local_230,(string *)header._8_8_,_S_bin);
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) != 0) {
    std::istream::read(local_230,(long)local_28);
    if ((local_22 & 4) != 0) {
      std::istream::seekg((long)local_230,0x200);
    }
    this->nMapperID = (byte)(((int)(uint)local_21 >> 4) << 4) | (byte)((int)(uint)local_22 >> 4);
    this->mirror = (uint)((local_22 & 1) != 0);
    local_23d = 1;
    this->nPRGBanks = local_24;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&this->vPRGMemory,(ulong)this->nPRGBanks << 0xe);
    puVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&this->vPRGMemory);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->vPRGMemory);
    std::istream::read(local_230,(long)puVar2);
    this->nCHRBanks = local_23;
    if (this->nCHRBanks == '\0') {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&this->vCHRMemory,0x2000);
    }
    else {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                (&this->vCHRMemory,(ulong)this->nCHRBanks << 0xd);
    }
    puVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&this->vCHRMemory);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->vCHRMemory);
    std::istream::read(local_230,(long)puVar2);
    if (this->nMapperID == '\0') {
      std::make_shared<Mapper_000,unsigned_char&,unsigned_char&>
                ((uchar *)&local_250,&this->nPRGBanks);
      std::shared_ptr<Mapper>::operator=(&this->pMapper,&local_250);
      std::shared_ptr<Mapper_000>::~shared_ptr(&local_250);
    }
    this->bImageValid = true;
  }
  std::ifstream::~ifstream(local_230);
  return;
}

Assistant:

Catridge::Catridge(const string &sFileName)
{
  struct sHeader
  {
    char name[4];
    uint8_t prg_rom_chunks;
    uint8_t chr_rom_chunks;
    uint8_t mapper1;
    uint8_t mapper2;
    uint8_t prg_ram_size;
    uint8_t tv_system1;
    uint8_t tv_system2;
    char unused[5];
  } header;

  std::ifstream ifs(sFileName, ifstream::binary);
  if (ifs.is_open())
  {
    ifs.read((char *)&header, sizeof(sHeader));

    if (header.mapper1 & 0x04u)
    {
      ifs.seekg(512, ios_base::cur);
    }

    nMapperID = ((header.mapper2 >> 4) << 4) | (header.mapper1 >> 4);
    mirror = (header.mapper1 & 0x01u) ? VERTICAL : HORIZONTAL;

    // "Discover" File format
    uint8_t nFileType = 1;

    if (nFileType == 0)
    {
    }

    if (nFileType == 1)
    {
      nPRGBanks = header.prg_rom_chunks;
      vPRGMemory.resize(nPRGBanks * 16384); // nPRGBanks * 16 KB
      ifs.read((char *)vPRGMemory.data(), vPRGMemory.size());

      nCHRBanks = header.chr_rom_chunks;
      if (nCHRBanks == 0)
      {
        vCHRMemory.resize(8192); // 8 KB
      }
      else
      {
        vCHRMemory.resize(nCHRBanks * 8192); // nPRGBanks * 8 KB
      }
      ifs.read((char *)vCHRMemory.data(), vCHRMemory.size());
    }

    if (nFileType == 2)
    {
    }

    switch (nMapperID)
    {
    case 0:
      pMapper = make_shared<Mapper_000>(nPRGBanks, nCHRBanks);
      break;
    default:
      break;
    }

    bImageValid = true;
  }
}